

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::MultiUPCEANReader::decodePattern
          (MultiUPCEANReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_4)

{
  PatternView begin_00;
  PatternView begin_01;
  PatternView begin_02;
  PatternView begin_03;
  PatternView begin_04;
  bool bVar1;
  EanAddOnSymbol EVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  undefined8 *in_RCX;
  long in_RSI;
  Barcode *in_RDI;
  PartialResult addOnRes;
  PatternView ext;
  SymbologyIdentifier symbologyIdentifier;
  Error error;
  PatternView begin;
  PartialResult res;
  int minSize;
  undefined8 in_stack_fffffffffffffbe8;
  enum_type e2;
  Error *pEVar6;
  enum_type e1;
  PatternView *in_stack_fffffffffffffbf0;
  Error *this_00;
  string *in_stack_fffffffffffffbf8;
  PartialResult *in_stack_fffffffffffffc00;
  BarcodeFormats f;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  double in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  undefined8 in_stack_fffffffffffffc28;
  Result *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3c;
  undefined1 in_stack_fffffffffffffc3d;
  undefined1 readerInit;
  string *in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc70;
  undefined2 in_stack_fffffffffffffc74;
  uint digitCount;
  PartialResult *in_stack_fffffffffffffc78;
  Result *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  SymbologyIdentifier in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  undefined8 in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  undefined8 uVar7;
  Barcode *__s;
  PartialResult *in_stack_fffffffffffffcf8;
  string local_2f8 [8];
  undefined1 in_stack_fffffffffffffd10 [24];
  Iterator in_stack_fffffffffffffd28;
  PartialResult local_290;
  Error *local_248;
  Error *pEStack_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  Flags<ZXing::BarcodeFormat> local_21c;
  string local_218 [36];
  Flags<ZXing::BarcodeFormat> local_1f4;
  string local_1f0 [80];
  string local_1a0 [84];
  undefined4 local_14c;
  Error *local_148;
  Error *pEStack_140;
  string *local_138;
  PartialResult *pPStack_130;
  Flags<ZXing::BarcodeFormat> local_11c;
  Error *local_118;
  Error *pEStack_110;
  string *local_108;
  PartialResult *pPStack_100;
  Flags<ZXing::BarcodeFormat> local_f8 [4];
  Error *local_e8;
  Error *pEStack_e0;
  string *local_d8;
  PartialResult *pPStack_d0;
  Int local_bc;
  Error *local_b8;
  Error *pEStack_b0;
  string *local_a8;
  PartialResult *pPStack_a0;
  string local_98 [32];
  Error *local_78;
  Error *pEStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_2c;
  undefined8 *local_20;
  
  e2 = (enum_type)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  local_2c = 0x21;
  __s = in_RDI;
  local_20 = in_RCX;
  FindLeftGuard<3,3,false>
            ((PatternView *)in_stack_fffffffffffffc30,
             (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
             (FixedPattern<3,_3,_false> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
            );
  *local_20 = local_50;
  local_20[1] = local_48;
  local_20[2] = local_40;
  local_20[3] = local_38;
  bVar1 = PatternView::isValid(in_stack_fffffffffffffbf0);
  e1 = (enum_type)in_stack_fffffffffffffbf0;
  if (!bVar1) {
    memset(__s,0,0xd8);
    Result::Result(in_stack_fffffffffffffc30);
    return in_RDI;
  }
  PartialResult::PartialResult(in_stack_fffffffffffffc00);
  local_b8 = (Error *)*local_20;
  pEStack_b0 = (Error *)local_20[1];
  local_a8 = (string *)local_20[2];
  pPStack_a0 = (PartialResult *)local_20[3];
  uVar7 = *(undefined8 *)(in_RSI + 8);
  local_bc = (Int)operator|(e1,e2);
  bVar1 = ReaderOptions::hasFormat
                    ((ReaderOptions *)in_stack_fffffffffffffbf8,
                     (BarcodeFormats)(Int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
  if (!bVar1) {
LAB_0029f4cc:
    in_stack_fffffffffffffca0 = *(undefined8 *)(in_RSI + 8);
    Flags<ZXing::BarcodeFormat>::Flags(local_f8,EAN8);
    bVar1 = ReaderOptions::hasFormat
                      ((ReaderOptions *)in_stack_fffffffffffffbf8,
                       (BarcodeFormats)(Int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
    if (bVar1) {
      local_108 = local_a8;
      pPStack_100 = pPStack_a0;
      local_118 = local_b8;
      pEStack_110 = pEStack_b0;
      begin_04._end = in_stack_fffffffffffffd28;
      begin_04._data = (Iterator)in_stack_fffffffffffffd10._0_8_;
      begin_04._size = in_stack_fffffffffffffd10._8_4_;
      begin_04._12_4_ = in_stack_fffffffffffffd10._12_4_;
      begin_04._base = (Iterator)in_stack_fffffffffffffd10._16_8_;
      pEVar6 = local_b8;
      this_00 = pEStack_b0;
      in_stack_fffffffffffffbf8 = local_a8;
      in_stack_fffffffffffffc00 = pPStack_a0;
      in_stack_fffffffffffffc9f = EAN8(in_stack_fffffffffffffcf8,begin_04);
      if ((bool)in_stack_fffffffffffffc9f) goto LAB_0029f69e;
    }
    f.i = (Int)((ulong)in_stack_fffffffffffffc00 >> 0x20);
    in_stack_fffffffffffffc90 = SUB84(*(undefined8 *)(in_RSI + 8),0);
    in_stack_fffffffffffffc94 = (undefined4)((ulong)*(undefined8 *)(in_RSI + 8) >> 0x20);
    Flags<ZXing::BarcodeFormat>::Flags(&local_11c,UPCE);
    bVar1 = ReaderOptions::hasFormat((ReaderOptions *)in_stack_fffffffffffffbf8,f);
    if (bVar1) {
      local_138 = local_a8;
      pPStack_130 = pPStack_a0;
      local_148 = local_b8;
      pEStack_140 = pEStack_b0;
      begin_03._8_7_ = in_stack_fffffffffffffca8;
      begin_03._data = (Iterator)in_stack_fffffffffffffca0;
      begin_03._15_1_ = in_stack_fffffffffffffcaf;
      begin_03._base = (Iterator)uVar7;
      begin_03._end = (Iterator)__s;
      pEVar6 = local_b8;
      this_00 = pEStack_b0;
      in_stack_fffffffffffffbf8 = local_a8;
      in_stack_fffffffffffffc00 = pPStack_a0;
      bVar1 = UPCE((PartialResult *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                   begin_03);
      if (bVar1) goto LAB_0029f69e;
    }
    __s->_format = None;
    __s->_ecLevel[0] = '\0';
    __s->_ecLevel[1] = '\0';
    __s->_ecLevel[2] = '\0';
    __s->_ecLevel[3] = '\0';
    __s->_version[0] = '\0';
    __s->_version[1] = '\0';
    __s->_version[2] = '\0';
    __s->_version[3] = '\0';
    __s->_lineCount = 0;
    (__s->_sai).id.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(__s->_sai).id.field_2 + 8) = 0;
    *(undefined8 *)&(__s->_sai).id = 0;
    (__s->_sai).id._M_string_length = 0;
    *(undefined8 *)&(__s->_readerOpts)._formats = 0;
    (__s->_sai).index = 0;
    (__s->_sai).count = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    *(undefined8 *)&__s->_readerOpts = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__s->_error)._line = 0;
    (__s->_error)._type = None;
    *(undefined5 *)&(__s->_error).field_0x2b = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    *(undefined8 *)((long)&(__s->_error)._msg.field_2 + 8) = 0;
    (__s->_error)._file = (char *)0x0;
    (__s->_error)._msg._M_string_length = 0;
    (__s->_error)._msg.field_2._M_allocated_capacity = 0;
    (__s->_content).symbology.code = '\0';
    (__s->_content).symbology.modifier = '\0';
    (__s->_content).symbology.eciModifierOffset = '\0';
    (__s->_content).symbology.aiFlag = None;
    (__s->_content).defaultCharset = Unknown;
    (__s->_content).hasECI = false;
    *(undefined2 *)&(__s->_content).field_0x36 = 0;
    *(undefined8 *)&(__s->_error)._msg = 0;
    (__s->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__s->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__s->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __s->_isMirrored = false;
    __s->_isInverted = false;
    __s->_readerInit = false;
    *(undefined5 *)&__s->field_0xd3 = 0;
    Result::Result(in_stack_fffffffffffffc30);
    local_14c = 1;
    goto LAB_0029fdd4;
  }
  local_d8 = local_a8;
  pPStack_d0 = pPStack_a0;
  local_e8 = local_b8;
  pEStack_e0 = pEStack_b0;
  begin_02._8_7_ = in_stack_fffffffffffffca8;
  begin_02._data = (Iterator)in_stack_fffffffffffffca0;
  begin_02._15_1_ = in_stack_fffffffffffffcaf;
  begin_02._base = (Iterator)uVar7;
  begin_02._end = (Iterator)__s;
  pEVar6 = local_b8;
  this_00 = pEStack_b0;
  in_stack_fffffffffffffbf8 = local_a8;
  in_stack_fffffffffffffc00 = pPStack_a0;
  in_stack_fffffffffffffcaf =
       EAN13((PartialResult *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),begin_02
            );
  if (!(bool)in_stack_fffffffffffffcaf) goto LAB_0029f4cc;
LAB_0029f69e:
  Error::Error(this_00);
  if (local_58 == 0x8000) {
    UPCEANCommon::ConvertUPCEtoUPCA<std::__cxx11::string>(in_stack_fffffffffffffdc8);
  }
  else {
    std::__cxx11::string::string(local_1a0,local_98);
  }
  bVar1 = GTIN::IsCheckDigitValid<char>(&this_00->_msg);
  digitCount = CONCAT13(bVar1,CONCAT12(bVar1,in_stack_fffffffffffffc74)) ^ 0xff0000;
  std::__cxx11::string::~string(local_1a0);
  if ((digitCount & 0x10000) != 0) {
    in_stack_fffffffffffffc68 = local_1f0;
    std::__cxx11::string::string(in_stack_fffffffffffffc68);
    Error::Error((Error *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (short)((ulong)in_stack_fffffffffffffc00 >> 0x30),
                 (Type)((ulong)in_stack_fffffffffffffc00 >> 0x28),in_stack_fffffffffffffbf8);
    Error::operator=(this_00,pEVar6);
    Error::~Error((Error *)0x29f78c);
    std::__cxx11::string::~string(local_1f0);
  }
  readerInit = (undefined1)((ulong)*(undefined8 *)(in_RSI + 8) >> 0x38);
  Flags<ZXing::BarcodeFormat>::Flags(&local_1f4,UPCA);
  bVar1 = ReaderOptions::hasFormat
                    ((ReaderOptions *)in_stack_fffffffffffffbf8,
                     (BarcodeFormats)(Int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
  if (((bVar1) && (local_58 == 0x200)) &&
     (pcVar5 = (char *)std::__cxx11::string::front(), *pcVar5 == '0')) {
    std::__cxx11::string::substr((ulong)local_218,(ulong)local_98);
    std::__cxx11::string::operator=(local_98,local_218);
    std::__cxx11::string::~string(local_218);
    local_58 = 0x4000;
  }
  if (local_58 == 0x200) {
    Flags<ZXing::BarcodeFormat>::Flags(&local_21c,EAN13);
    bVar1 = ReaderOptions::hasFormat
                      ((ReaderOptions *)in_stack_fffffffffffffbf8,
                       (BarcodeFormats)(Int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
    if (bVar1) goto LAB_0029f969;
    __s->_format = None;
    __s->_ecLevel[0] = '\0';
    __s->_ecLevel[1] = '\0';
    __s->_ecLevel[2] = '\0';
    __s->_ecLevel[3] = '\0';
    __s->_version[0] = '\0';
    __s->_version[1] = '\0';
    __s->_version[2] = '\0';
    __s->_version[3] = '\0';
    __s->_lineCount = 0;
    (__s->_sai).id.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(__s->_sai).id.field_2 + 8) = 0;
    *(undefined8 *)&(__s->_sai).id = 0;
    (__s->_sai).id._M_string_length = 0;
    *(undefined8 *)&(__s->_readerOpts)._formats = 0;
    (__s->_sai).index = 0;
    (__s->_sai).count = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    *(undefined8 *)&__s->_readerOpts = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__s->_error)._line = 0;
    (__s->_error)._type = None;
    *(undefined5 *)&(__s->_error).field_0x2b = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    *(undefined8 *)((long)&(__s->_error)._msg.field_2 + 8) = 0;
    (__s->_error)._file = (char *)0x0;
    (__s->_error)._msg._M_string_length = 0;
    (__s->_error)._msg.field_2._M_allocated_capacity = 0;
    (__s->_content).symbology.code = '\0';
    (__s->_content).symbology.modifier = '\0';
    (__s->_content).symbology.eciModifierOffset = '\0';
    (__s->_content).symbology.aiFlag = None;
    (__s->_content).defaultCharset = Unknown;
    (__s->_content).hasECI = false;
    *(undefined2 *)&(__s->_content).field_0x36 = 0;
    *(undefined8 *)&(__s->_error)._msg = 0;
    (__s->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__s->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__s->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __s->_isMirrored = false;
    __s->_isInverted = false;
    __s->_readerInit = false;
    *(undefined5 *)&__s->field_0xd3 = 0;
    Result::Result(in_stack_fffffffffffffc30);
    local_14c = 1;
  }
  else {
LAB_0029f969:
    local_20[2] = local_68;
    local_20[3] = uStack_60;
    *local_20 = local_78;
    local_20[1] = pEStack_70;
    local_248 = local_78;
    pEStack_240 = pEStack_70;
    PartialResult::PartialResult(in_stack_fffffffffffffc00);
    EVar2 = ReaderOptions::eanAddOnSymbol(*(ReaderOptions **)(in_RSI + 8));
    if ((EVar2 != Ignore) && (bVar1 = PatternView::skipSymbol((PatternView *)0x29fa10), bVar1)) {
      PatternView::sum((PatternView *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       in_stack_fffffffffffffc0c);
      uVar3 = PatternView::skipSingle((PatternView *)this_00,(int)((ulong)pEVar6 >> 0x20));
      if (((bool)uVar3) &&
         ((begin_00._data._4_4_ = in_stack_fffffffffffffc94,
          begin_00._data._0_4_ = in_stack_fffffffffffffc90,
          begin_00._8_7_ = in_stack_fffffffffffffc98, begin_00._15_1_ = in_stack_fffffffffffffc9f,
          begin_00._base = (Iterator)in_stack_fffffffffffffca0,
          begin_00._end._0_7_ = in_stack_fffffffffffffca8,
          begin_00._end._7_1_ = in_stack_fffffffffffffcaf, pEVar6 = local_248, this_00 = pEStack_240
          , uVar4 = AddOn(in_stack_fffffffffffffc78,begin_00,digitCount), (bool)uVar4 ||
          (begin_01._data._4_4_ = in_stack_fffffffffffffc94,
          begin_01._data._0_4_ = in_stack_fffffffffffffc90,
          begin_01._8_7_ = in_stack_fffffffffffffc98, begin_01._15_1_ = in_stack_fffffffffffffc9f,
          begin_01._base = (Iterator)in_stack_fffffffffffffca0,
          begin_01._end._0_7_ = in_stack_fffffffffffffca8,
          begin_01._end._7_1_ = in_stack_fffffffffffffcaf, pEVar6 = local_248, this_00 = pEStack_240
          , in_stack_fffffffffffffc3d = AddOn(in_stack_fffffffffffffc78,begin_01,digitCount),
          (bool)in_stack_fffffffffffffc3d)))) {
        std::operator+((char *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffc3d,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38)))),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc30);
        std::__cxx11::string::operator+=(local_98,local_2f8);
        std::__cxx11::string::~string(local_2f8);
        *local_20 = local_290.end._data;
        local_20[1] = local_290.end._8_8_;
        local_20[2] = local_290.end._base;
        local_20[3] = local_290.end._end;
      }
    }
    EVar2 = ReaderOptions::eanAddOnSymbol(*(ReaderOptions **)(in_RSI + 8));
    if ((EVar2 != Require) || (bVar1 = PartialResult::isValid(&local_290), bVar1)) {
      PatternView::pixelsInFront((PatternView *)this_00);
      PatternView::pixelsTillEnd((PatternView *)this_00);
      Error::Error(this_00,pEVar6);
      Result::Result(in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->txt,digitCount,
                     in_stack_fffffffffffffc70,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20),
                     (BarcodeFormat)in_stack_fffffffffffffc68,in_stack_fffffffffffffc90,
                     (Error *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                     (bool)readerInit);
      Error::~Error((Error *)0x29fd68);
    }
    else {
      __s->_format = None;
      __s->_ecLevel[0] = '\0';
      __s->_ecLevel[1] = '\0';
      __s->_ecLevel[2] = '\0';
      __s->_ecLevel[3] = '\0';
      __s->_version[0] = '\0';
      __s->_version[1] = '\0';
      __s->_version[2] = '\0';
      __s->_version[3] = '\0';
      __s->_lineCount = 0;
      (__s->_sai).id.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(__s->_sai).id.field_2 + 8) = 0;
      *(undefined8 *)&(__s->_sai).id = 0;
      (__s->_sai).id._M_string_length = 0;
      *(undefined8 *)&(__s->_readerOpts)._formats = 0;
      (__s->_sai).index = 0;
      (__s->_sai).count = 0;
      (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      *(undefined8 *)&__s->_readerOpts = 0;
      (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (__s->_error)._line = 0;
      (__s->_error)._type = None;
      *(undefined5 *)&(__s->_error).field_0x2b = 0;
      (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (__s->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      *(undefined8 *)((long)&(__s->_error)._msg.field_2 + 8) = 0;
      (__s->_error)._file = (char *)0x0;
      (__s->_error)._msg._M_string_length = 0;
      (__s->_error)._msg.field_2._M_allocated_capacity = 0;
      (__s->_content).symbology.code = '\0';
      (__s->_content).symbology.modifier = '\0';
      (__s->_content).symbology.eciModifierOffset = '\0';
      (__s->_content).symbology.aiFlag = None;
      (__s->_content).defaultCharset = Unknown;
      (__s->_content).hasECI = false;
      *(undefined2 *)&(__s->_content).field_0x36 = 0;
      *(undefined8 *)&(__s->_error)._msg = 0;
      (__s->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__s->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__s->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__s->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __s->_isMirrored = false;
      __s->_isInverted = false;
      __s->_readerInit = false;
      *(undefined5 *)&__s->field_0xd3 = 0;
      Result::Result((Result *)0x0);
    }
    local_14c = 1;
    PartialResult::~PartialResult((PartialResult *)0x29fda5);
  }
  Error::~Error((Error *)0x29fdc3);
LAB_0029fdd4:
  PartialResult::~PartialResult((PartialResult *)0x29fde1);
  return in_RDI;
}

Assistant:

Barcode MultiUPCEANReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>&) const
{
	const int minSize = 3 + 6*4 + 6; // UPC-E

	next = FindLeftGuard(next, minSize, END_PATTERN, QUIET_ZONE_LEFT);
	if (!next.isValid())
		return {};

	PartialResult res;
	auto begin = next;
	
	if (!(((_opts.hasFormat(BarcodeFormat::EAN13 | BarcodeFormat::UPCA)) && EAN13(res, begin)) ||
		  (_opts.hasFormat(BarcodeFormat::EAN8) && EAN8(res, begin)) ||
		  (_opts.hasFormat(BarcodeFormat::UPCE) && UPCE(res, begin))))
		return {};

	Error error;
	if (!GTIN::IsCheckDigitValid(res.format == BarcodeFormat::UPCE ? UPCEANCommon::ConvertUPCEtoUPCA(res.txt) : res.txt))
		error = ChecksumError();

	// If UPC-A was a requested format and we detected a EAN-13 code with a leading '0', then we drop the '0' and call it
	// a UPC-A code.
	// TODO: this is questionable
	if (_opts.hasFormat(BarcodeFormat::UPCA) && res.format == BarcodeFormat::EAN13 && res.txt.front() == '0') {
		res.txt = res.txt.substr(1);
		res.format = BarcodeFormat::UPCA;
	}

	// if we explicitly requested UPCA but not EAN13, don't return an EAN13 symbol
	if (res.format == BarcodeFormat::EAN13 && ! _opts.hasFormat(BarcodeFormat::EAN13))
		return {};

	// Symbology identifier modifiers ISO/IEC 15420:2009 Annex B Table B.1
	// ISO/IEC 15420:2009 (& GS1 General Specifications 5.1.3) states that the content for "]E0" should be 13 digits,
	// i.e. converted to EAN-13 if UPC-A/E, but not doing this here to maintain backward compatibility
	SymbologyIdentifier symbologyIdentifier = {'E', res.format == BarcodeFormat::EAN8 ? '4' : '0'};

	next = res.end;

	auto ext = res.end;
	PartialResult addOnRes;
	if (_opts.eanAddOnSymbol() != EanAddOnSymbol::Ignore && ext.skipSymbol() && ext.skipSingle(static_cast<int>(begin.sum() * 3.5))
		&& (AddOn(addOnRes, ext, 5) || AddOn(addOnRes, ext, 2))) {
		// ISO/IEC 15420:2009 states that the content for "]E3" should be 15 or 18 digits, i.e. converted to EAN-13
		// and extended with no separator, and that the content for "]E4" should be 8 digits, i.e. no add-on
		res.txt += " " + addOnRes.txt;
		next = addOnRes.end;

		if (res.format != BarcodeFormat::EAN8) // Keeping EAN-8 with add-on as "]E4"
			symbologyIdentifier.modifier = '3'; // Combined packet, EAN-13, UPC-A, UPC-E, with add-on
	}
	
	if (_opts.eanAddOnSymbol() == EanAddOnSymbol::Require && !addOnRes.isValid())
		return {};

	return Barcode(res.txt, rowNumber, begin.pixelsInFront(), next.pixelsTillEnd(), res.format, symbologyIdentifier, error);
}